

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QList<QUrl> * __thiscall
QFileDialogPrivate::addDefaultSuffixToUrls(QFileDialogPrivate *this,QList<QUrl> *urlsToFix)

{
  bool bVar1;
  QUrl *pQVar2;
  qsizetype qVar3;
  QList<QUrl> *in_RDX;
  QStringView *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar4;
  qsizetype idx;
  QList<QUrl> *__range1;
  QList<QUrl> *urls;
  QString urlPath;
  QUrl url;
  const_iterator __end1;
  const_iterator __begin1;
  QString defaultSuffix;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
  *in_stack_fffffffffffffec8;
  CaseSensitivity cs;
  undefined7 in_stack_fffffffffffffed0;
  byte in_stack_fffffffffffffed7;
  QStringView *this_00;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *n;
  QList<QUrl> *in_stack_fffffffffffffef8;
  qsizetype in_stack_ffffffffffffff38;
  QChar local_aa [9];
  QStringView local_98;
  QChar local_86 [3];
  QString local_80;
  QUrl local_68;
  QUrl *local_60;
  const_iterator local_58;
  const_iterator local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QUrl>::QList((QList<QUrl> *)0x7562fc);
  QList<QUrl>::size(in_RDX);
  QList<QUrl>::reserve(in_stack_fffffffffffffef8,in_stack_ffffffffffffff38);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x756351);
  QFileDialogOptions::defaultSuffix();
  local_50.i = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QList<QUrl>::begin((QList<QUrl> *)
                                CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  local_58.i = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = QList<QUrl>::end((QList<QUrl> *)
                              CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  while( true ) {
    local_60 = local_58.i;
    bVar1 = QList<QUrl>::const_iterator::operator!=(&local_50,local_58);
    if (!bVar1) break;
    local_68.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QList<QUrl>::const_iterator::operator*(&local_50);
    QUrl::QUrl(&local_68,(QUrl *)pQVar2);
    bVar1 = QString::isEmpty((QString *)0x756423);
    if (!bVar1) {
      local_80.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_80.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_80.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 (ComponentFormattingOption)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      QUrl::path((QFlags_conflict1 *)&local_80);
      QChar::QChar<char16_t,_true>(local_86,L'/');
      in_stack_fffffffffffffec8 =
           (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
           QString::lastIndexOf
                     ((QString *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                      (QChar)(char16_t)((ulong)in_RDI >> 0x30),cs);
      n = in_stack_fffffffffffffec8;
      qVar3 = QString::size(&local_80);
      in_stack_fffffffffffffed7 = 0;
      if (in_stack_fffffffffffffec8 !=
          (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)(qVar3 + -1)
         ) {
        QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
        local_98 = QStringView::mid(in_RSI,(qsizetype)in_RDX,(qsizetype)n);
        QChar::QChar<char16_t,_true>(local_aa,L'.');
        bVar1 = QStringView::contains
                          ((QStringView *)
                           CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                           (QChar)(char16_t)((ulong)in_RSI >> 0x30),
                           (CaseSensitivity)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        in_stack_fffffffffffffed7 = bVar1 ^ 0xff;
      }
      if ((in_stack_fffffffffffffed7 & 1) != 0) {
        QVar4 = ::operator+((QString *)in_RDI,
                            (char16_t *)
                            CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        local_30 = QVar4.a;
        local_28 = QVar4.b;
        ::operator+((QStringBuilder<const_QString_&,_char16_t> *)
                    CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                    (QString *)in_stack_fffffffffffffec8);
        ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffec8);
        QUrl::setPath((QString *)&local_68,(ParsingMode)&stack0xffffffffffffff38);
        QString::~QString((QString *)0x7565f1);
      }
      QString::~QString((QString *)0x7565fe);
    }
    QList<QUrl>::append((QList<QUrl> *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                        ,(parameter_type)in_stack_fffffffffffffec8);
    QUrl::~QUrl(&local_68);
    QList<QUrl>::const_iterator::operator++(&local_50);
  }
  QString::~QString((QString *)0x756641);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QUrl> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QFileDialogPrivate::addDefaultSuffixToUrls(const QList<QUrl> &urlsToFix) const
{
    QList<QUrl> urls;
    urls.reserve(urlsToFix.size());
    // if the filename has no suffix, add the default suffix
    const QString defaultSuffix = options->defaultSuffix();
    for (QUrl url : urlsToFix) {
        if (!defaultSuffix.isEmpty()) {
            const QString urlPath = url.path();
            const auto idx = urlPath.lastIndexOf(u'/');
            if (idx != (urlPath.size() - 1) && !QStringView{urlPath}.mid(idx + 1).contains(u'.'))
                url.setPath(urlPath + u'.' + defaultSuffix);
        }
        urls.append(url);
    }
    return urls;
}